

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcDebugGetSourceLocationLineAndColumn(char *sourceLocation,uint moduleIndex,uint *column)

{
  char *pcVar1;
  ExternModuleInfo *pEVar2;
  uint local_64;
  char *local_58;
  char *lastLineStart;
  char *pos;
  uint line;
  char *sourceStart;
  char *fullSource;
  ExternModuleInfo *modules;
  uint *puStack_20;
  uint moduleCount;
  uint *column_local;
  char *pcStack_10;
  uint moduleIndex_local;
  char *sourceLocation_local;
  
  modules._4_4_ = 0;
  puStack_20 = column;
  column_local._4_4_ = moduleIndex;
  pcStack_10 = sourceLocation;
  pEVar2 = nullcDebugModuleInfo((uint *)((long)&modules + 4));
  local_58 = nullcDebugSource();
  if (column_local._4_4_ < modules._4_4_) {
    local_64 = pEVar2[column_local._4_4_].sourceOffset;
  }
  else {
    local_64 = pEVar2[modules._4_4_ - 1].sourceOffset + pEVar2[modules._4_4_ - 1].sourceSize;
  }
  local_58 = local_58 + local_64;
  pos._4_4_ = 0;
  lastLineStart = local_58;
  while (lastLineStart < pcStack_10) {
    if (*lastLineStart == '\r') {
      pos._4_4_ = pos._4_4_ + 1;
      pcVar1 = lastLineStart + 1;
      if (lastLineStart[1] == '\n') {
        pcVar1 = lastLineStart + 2;
      }
      lastLineStart = pcVar1;
      local_58 = lastLineStart;
    }
    else {
      if (*lastLineStart == '\n') {
        pos._4_4_ = pos._4_4_ + 1;
        local_58 = lastLineStart + 1;
      }
      lastLineStart = lastLineStart + 1;
    }
  }
  *puStack_20 = (int)lastLineStart - (int)local_58;
  return pos._4_4_;
}

Assistant:

unsigned nullcDebugGetSourceLocationLineAndColumn(const char *sourceLocation, unsigned moduleIndex, unsigned &column)
{
	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	const char *sourceStart = fullSource + (moduleIndex < moduleCount ? modules[moduleIndex].sourceOffset : modules[moduleCount - 1].sourceOffset + modules[moduleCount - 1].sourceSize);

	unsigned line = 0;

	const char *pos = sourceStart;
	const char *lastLineStart = pos;

	while(pos < sourceLocation)
	{
		if(*pos == '\r')
		{
			line++;

			pos++;

			if(*pos == '\n')
				pos++;

			lastLineStart = pos;
		}
		else if(*pos == '\n')
		{
			line++;

			pos++;

			lastLineStart = pos;
		}
		else
		{
			pos++;
		}
	}

	column = int(pos - lastLineStart);

	return line;
}